

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_0::MergingIterator::SeekToLast(MergingIterator *this)

{
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  IteratorWrapper *in_stack_ffffffffffffffd8;
  undefined4 local_14;
  MergingIterator *this_00;
  
  this_00 = *(MergingIterator **)(in_FS_OFFSET + 0x28);
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x38); local_14 = local_14 + 1) {
    IteratorWrapper::SeekToLast(in_stack_ffffffffffffffd8);
  }
  FindLargest(this_00);
  *(undefined4 *)(in_RDI + 0x48) = 1;
  if (*(MergingIterator **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SeekToLast() override {
    for (int i = 0; i < n_; i++) {
      children_[i].SeekToLast();
    }
    FindLargest();
    direction_ = kReverse;
  }